

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Routines_Disasm.c
# Opt level: O2

void GvEw(PDISASM pMyDisasm)

{
  (pMyDisasm->Reserved_).OriginalOperandSize = (pMyDisasm->Reserved_).OperandSize;
  (pMyDisasm->Reserved_).OperandSize = 0x10;
  (pMyDisasm->Reserved_).MemDecoration = 0x66;
  decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
  (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
  decodeRegOpcode(&pMyDisasm->Operand1,pMyDisasm);
  (pMyDisasm->Reserved_).EIP_ =
       (pMyDisasm->Reserved_).EIP_ + (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2);
  return;
}

Assistant:

void __bea_callspec__ GvEw(PDISASM pMyDisasm)
{
  GV.MemDecoration = Arg2word;
  GV.OriginalOperandSize = GV.OperandSize;
  GV.OperandSize = 16;
  decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
  GV.OperandSize = GV.OriginalOperandSize;
  decodeRegOpcode(&pMyDisasm->Operand1, pMyDisasm);
  GV.EIP_ += GV.DECALAGE_EIP+2;
}